

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O0

size_t luaC_separateudata(lua_State *L,int all)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  TValue *local_48;
  TValue *local_40;
  GCObject *curr;
  GCObject **p;
  size_t deadmem;
  global_State *g;
  int all_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  p = (GCObject **)0x0;
  pGVar2 = (GCObject *)pgVar1->mainthread;
  while (curr = pGVar2, pGVar2 = (curr->gch).next, pGVar2 != (GCObject *)0x0) {
    if (((((pGVar2->gch).marked & 3) != 0) || (all != 0)) && (((pGVar2->gch).marked & 8) == 0)) {
      if ((pGVar2->h).metatable == (Table *)0x0) {
        local_40 = (TValue *)0x0;
      }
      else {
        if ((((pGVar2->h).metatable)->flags & 4) == 0) {
          local_48 = luaT_gettm((pGVar2->h).metatable,TM_GC,L->l_G->tmname[2]);
        }
        else {
          local_48 = (TValue *)0x0;
        }
        local_40 = local_48;
      }
      if (local_40 == (TValue *)0x0) {
        (pGVar2->gch).marked = (pGVar2->gch).marked | 8;
      }
      else {
        p = (GCObject **)((long)&((pGVar2->th).l_G)->rootgc + (long)p);
        (pGVar2->gch).marked = (pGVar2->gch).marked | 8;
        (curr->gch).next = (pGVar2->gch).next;
        if (pgVar1->tmudata == (GCObject *)0x0) {
          (pGVar2->gch).next = pGVar2;
          pgVar1->tmudata = pGVar2;
          pGVar2 = curr;
        }
        else {
          (pGVar2->gch).next = (pgVar1->tmudata->gch).next;
          (pgVar1->tmudata->gch).next = pGVar2;
          pgVar1->tmudata = pGVar2;
          pGVar2 = curr;
        }
      }
    }
  }
  return (size_t)p;
}

Assistant:

size_t luaC_separateudata (lua_State *L, int all) {
  global_State *g = G(L);
  size_t deadmem = 0;
  GCObject **p = &g->mainthread->next;
  GCObject *curr;
  while ((curr = *p) != NULL) {
    if (!(iswhite(curr) || all) || isfinalized(gco2u(curr)))
      p = &curr->gch.next;  /* don't bother with them */
    else if (fasttm(L, gco2u(curr)->metatable, TM_GC) == NULL) {
      markfinalized(gco2u(curr));  /* don't need finalization */
      p = &curr->gch.next;
    }
    else {  /* must call its gc method */
      deadmem += sizeudata(gco2u(curr));
      markfinalized(gco2u(curr));
      *p = curr->gch.next;
      /* link `curr' at the end of `tmudata' list */
      if (g->tmudata == NULL)  /* list is empty? */
        g->tmudata = curr->gch.next = curr;  /* creates a circular list */
      else {
        curr->gch.next = g->tmudata->gch.next;
        g->tmudata->gch.next = curr;
        g->tmudata = curr;
      }
    }
  }
  return deadmem;
}